

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BringWindowToFocusFront(ImGuiWindow *window)

{
  short *psVar1;
  ImGuiWindow **ppIVar2;
  ImGuiContext *pIVar3;
  long lVar4;
  long lVar5;
  
  pIVar3 = GImGui;
  lVar4 = (long)(GImGui->WindowsFocusOrder).Size;
  if ((GImGui->WindowsFocusOrder).Data[lVar4 + -1] != window) {
    for (lVar5 = (long)window->FocusOrder; lVar5 < lVar4 + -1; lVar5 = lVar5 + 1) {
      ppIVar2 = (pIVar3->WindowsFocusOrder).Data;
      ppIVar2[lVar5] = ppIVar2[lVar5 + 1];
      psVar1 = &(pIVar3->WindowsFocusOrder).Data[lVar5]->FocusOrder;
      *psVar1 = *psVar1 + -1;
    }
    (pIVar3->WindowsFocusOrder).Data[lVar4 + -1] = window;
    window->FocusOrder = (short)(lVar4 + -1);
  }
  return;
}

Assistant:

void ImGui::BringWindowToFocusFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == window->RootWindow);

    const int cur_order = window->FocusOrder;
    IM_ASSERT(g.WindowsFocusOrder[cur_order] == window);
    if (g.WindowsFocusOrder.back() == window)
        return;

    const int new_order = g.WindowsFocusOrder.Size - 1;
    for (int n = cur_order; n < new_order; n++)
    {
        g.WindowsFocusOrder[n] = g.WindowsFocusOrder[n + 1];
        g.WindowsFocusOrder[n]->FocusOrder--;
        IM_ASSERT(g.WindowsFocusOrder[n]->FocusOrder == n);
    }
    g.WindowsFocusOrder[new_order] = window;
    window->FocusOrder = (short)new_order;
}